

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O3

bool dxil_spv::emit_derivative_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TypeID TVar5;
  Id IVar6;
  TypeID TVar7;
  Id IVar8;
  Builder *pBVar9;
  Type *pTVar10;
  Operation *pOVar11;
  Value *pVVar12;
  Operation *pOVar13;
  Operation *pOVar14;
  Capability local_54;
  Operation *local_50;
  Operation *local_48;
  uint local_3c;
  CallInst *local_38;
  
  pBVar9 = Converter::Impl::builder(impl);
  if ((impl->execution_mode_meta).synthesize_dummy_derivatives == true) {
    pTVar10 = LLVMBC::Value::getType((Value *)instruction);
    TVar5 = LLVMBC::Type::getTypeID(pTVar10);
    if ((TVar5 == HalfTyID) &&
       (bVar3 = Converter::Impl::support_native_fp16_operations(impl), bVar3)) {
      IVar6 = spv::Builder::makeFloat16Constant(pBVar9,0,false);
    }
    else {
      IVar6 = spv::Builder::makeFloatConstant(pBVar9,0.0,false);
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar6);
    return true;
  }
  if ((impl->execution_model != ExecutionModelFragment) &&
     ((impl->options).compute_shader_derivatives == false)) {
    if (opcode - OpDPdxFine < 2) {
      emit_expect_assume_quad_uniform(impl);
      pBVar9 = Converter::Impl::builder(impl);
      local_54 = CapabilityGroupNonUniform;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar9->capabilities,&local_54);
      local_54 = CapabilityGroupNonUniformQuad;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar9->capabilities,&local_54);
      pTVar10 = LLVMBC::Value::getType((Value *)instruction);
      IVar6 = Converter::Impl::get_type_id(impl,pTVar10,0);
      local_50 = (Operation *)CONCAT44(local_50._4_4_,IVar6);
      pOVar11 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar6);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,3,false);
      Operation::add_id(pOVar11,IVar6);
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      Operation::add_id(pOVar11,IVar6);
      local_3c = (uint)(opcode == OpDPdyFine);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,(uint)(opcode == OpDPdyFine),false);
      Operation::add_id(pOVar11,IVar6);
      Converter::Impl::add(impl,pOVar11,false);
      IVar6 = (Id)local_50;
      pOVar13 = Converter::Impl::allocate(impl,OpFSub,(Id)local_50);
      Operation::add_id(pOVar13,pOVar11->id);
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar8 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      Operation::add_id(pOVar13,IVar8);
      local_48 = pOVar13;
      Converter::Impl::add(impl,pOVar13,false);
      pOVar11 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar6);
      local_50 = pOVar11;
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,3,false);
      Operation::add_id(pOVar11,IVar6);
      Operation::add_id(pOVar11,pOVar13->id);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      uVar1 = local_3c;
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,local_3c,false);
      Operation::add_id(pOVar11,IVar6);
      Converter::Impl::add(impl,pOVar11,false);
      IVar6 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,BuiltInSubgroupLocalInvocationId);
      IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      pOVar11 = Converter::Impl::allocate(impl,OpLoad,IVar8);
      Operation::add_id(pOVar11,IVar6);
      Converter::Impl::add(impl,pOVar11,false);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      pOVar13 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar6);
      Operation::add_id(pOVar13,pOVar11->id);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,uVar1 + 1,false);
      Operation::add_id(pOVar13,IVar6);
      Converter::Impl::add(impl,pOVar13,false);
      IVar6 = spv::Builder::makeBoolType(pBVar9);
      pOVar14 = Converter::Impl::allocate(impl,OpINotEqual,IVar6);
      Operation::add_id(pOVar14,pOVar13->id);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
      Operation::add_id(pOVar14,IVar6);
      Converter::Impl::add(impl,pOVar14,false);
      pOVar11 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
      Operation::add_id(pOVar11,pOVar14->id);
      Operation::add_id(pOVar11,local_50->id);
      Operation::add_id(pOVar11,local_48->id);
    }
    else {
      if (1 < opcode - OpDPdxCoarse) {
        return false;
      }
      emit_expect_assume_quad_uniform(impl);
      pBVar9 = Converter::Impl::builder(impl);
      local_54 = CapabilityGroupNonUniformQuad;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar9->capabilities,&local_54);
      pTVar10 = LLVMBC::Value::getType((Value *)instruction);
      IVar6 = Converter::Impl::get_type_id(impl,pTVar10,0);
      pOVar11 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar6);
      IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar8 = spv::Builder::makeIntConstant(pBVar9,IVar8,3,false);
      Operation::add_id(pOVar11,IVar8);
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar8 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      local_48 = pOVar11;
      Operation::add_id(pOVar11,IVar8);
      IVar8 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar8 = spv::Builder::makeIntConstant(pBVar9,IVar8,0,false);
      Operation::add_id(pOVar11,IVar8);
      pOVar14 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar6);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,3,false);
      Operation::add_id(pOVar14,IVar6);
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      Operation::add_id(pOVar14,IVar6);
      IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,(opcode == OpDPdyCoarse) + 1,false);
      Operation::add_id(pOVar14,IVar6);
      pOVar11 = Converter::Impl::allocate(impl,OpFSub,(Value *)instruction);
      Operation::add_id(pOVar11,pOVar14->id);
      pOVar13 = local_48;
      Operation::add_id(pOVar11,local_48->id);
      Converter::Impl::add(impl,pOVar13,false);
      Converter::Impl::add(impl,pOVar14,false);
    }
    Converter::Impl::add(impl,pOVar11,false);
    return true;
  }
  pTVar10 = LLVMBC::Value::getType((Value *)instruction);
  TVar5 = LLVMBC::Type::getTypeID(pTVar10);
  pTVar10 = LLVMBC::Value::getType((Value *)instruction);
  TVar7 = LLVMBC::Type::getTypeID(pTVar10);
  local_38 = instruction;
  if (TVar7 == HalfTyID) {
    bVar4 = Converter::Impl::support_native_fp16_operations(impl);
    bVar3 = !bVar4;
    bVar2 = bVar3;
    if (TVar5 != FloatTyID && bVar4) {
LAB_0016765f:
      IVar8 = spv::Builder::makeFloatType(pBVar9,0x20);
      pOVar11 = Converter::Impl::allocate(impl,OpFConvert,IVar8);
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      bVar2 = false;
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      Operation::add_id(pOVar11,IVar6);
      Converter::Impl::add(impl,pOVar11,false);
      IVar6 = pOVar11->id;
      pOVar11 = Converter::Impl::allocate(impl,opcode,IVar8);
      goto LAB_001676c9;
    }
  }
  else {
    bVar3 = false;
    bVar2 = false;
    if (TVar5 != FloatTyID) goto LAB_0016765f;
  }
  bVar3 = bVar2;
  pOVar11 = Converter::Impl::allocate(impl,opcode,(Value *)instruction);
  pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar6 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
  bVar2 = true;
LAB_001676c9:
  Operation::add_id(pOVar11,IVar6);
  Converter::Impl::add(impl,pOVar11,false);
  if (bVar3) {
    pTVar10 = LLVMBC::Value::getType((Value *)local_38);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar10,pOVar11->id,false);
  }
  if (!bVar2) {
    pOVar13 = Converter::Impl::allocate(impl,OpFConvert,(Value *)local_38);
    Operation::add_id(pOVar13,pOVar11->id);
    Converter::Impl::add(impl,pOVar13,false);
  }
  pBVar9 = Converter::Impl::builder(impl);
  local_54 = CapabilityDerivativeControl;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar9->capabilities,&local_54);
  return true;
}

Assistant:

bool emit_derivative_instruction(spv::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		spv::Id constant_0;
		if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
		    impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
		}

		impl.rewrite_value(instruction, constant_0);
		return true;
	}

	if (impl.execution_model != spv::ExecutionModelFragment &&
	    !impl.options.compute_shader_derivatives)
	{
		return emit_derivative_instruction_quad(opcode, impl, instruction);
	}

	bool relax_precision = false;
	spv::Id input_id;

	// SPIR-V only supports 32-bit derivatives.
	bool fp32 = instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
	    !impl.support_native_fp16_operations())
	{
		fp32 = true;
		relax_precision = true;
	}

	Operation *op;
	if (fp32)
	{
		op = impl.allocate(opcode, instruction);
		// Somewhat redundant, but avoid changing reference output
		// for all shaders that use derivatives with constants.
		input_id = impl.get_id_for_value(instruction->getOperand(1));
	}
	else
	{
		spv::Id fp32_type = builder.makeFloatType(32);
		auto *cast_op = impl.allocate(spv::OpFConvert, fp32_type);
		cast_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(cast_op);
		input_id = cast_op->id;

		op = impl.allocate(opcode, fp32_type);
	}

	op->add_id(input_id);
	impl.add(op);

	if (relax_precision)
		impl.decorate_relaxed_precision(instruction->getType(), op->id, false);

	if (!fp32)
	{
		auto *cast_op = impl.allocate(spv::OpFConvert, instruction);
		cast_op->add_id(op->id);
		impl.add(cast_op);
	}

	impl.builder().addCapability(spv::CapabilityDerivativeControl);
	return true;
}